

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smatrix.h
# Opt level: O1

SMatrix<double,_3,_3> * __thiscall
gmath::SMatrix<double,_3,_3>::operator+
          (SMatrix<double,_3,_3> *__return_storage_ptr__,SMatrix<double,_3,_3> *this,
          SMatrix<double,_3,_3> *a)

{
  undefined1 auVar1 [16];
  SMatrix<double,_3,_3> *pSVar2;
  int k;
  long lVar3;
  SMatrix<double,_3,_3> *ret;
  int i;
  long lVar4;
  undefined1 auVar5 [16];
  
  pSVar2 = __return_storage_ptr__;
  __return_storage_ptr__->v[2][0] = 0.0;
  __return_storage_ptr__->v[2][1] = 0.0;
  __return_storage_ptr__->v[1][1] = 0.0;
  __return_storage_ptr__->v[1][2] = 0.0;
  __return_storage_ptr__->v[0][2] = 0.0;
  __return_storage_ptr__->v[1][0] = 0.0;
  __return_storage_ptr__->v[0][0] = 0.0;
  __return_storage_ptr__->v[0][1] = 0.0;
  __return_storage_ptr__->v[2][2] = 0.0;
  auVar1 = _DAT_00163c20;
  lVar3 = 0;
  auVar5 = _DAT_00163c10;
  do {
    if (SUB164(auVar5 ^ auVar1,4) == -0x80000000 && SUB164(auVar5 ^ auVar1,0) < -0x7ffffffd) {
      *(undefined8 *)((long)__return_storage_ptr__->v[0] + lVar3) = 0x3ff0000000000000;
      *(undefined8 *)((long)__return_storage_ptr__->v[1] + lVar3 + 8) = 0x3ff0000000000000;
    }
    lVar4 = auVar5._8_8_;
    auVar5._0_8_ = auVar5._0_8_ + 2;
    auVar5._8_8_ = lVar4 + 2;
    lVar3 = lVar3 + 0x40;
  } while (lVar3 != 0x80);
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      (*(double (*) [3])*(double (*) [3])__return_storage_ptr__)[lVar4] =
           (*(double (*) [3])*(double (*) [3])this)[lVar4] +
           (*(double (*) [3])*(double (*) [3])a)[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar3 = lVar3 + 1;
    this = (SMatrix<double,_3,_3> *)((long)this + 0x18);
    a = (SMatrix<double,_3,_3> *)((long)a + 0x18);
    __return_storage_ptr__ = (SMatrix<double,_3,_3> *)((long)__return_storage_ptr__ + 0x18);
  } while (lVar3 != 3);
  return pSVar2;
}

Assistant:

SMatrix<T, nrows, ncols> operator+(const SMatrix<T, nrows, ncols> &a) const
    {
      SMatrix<T, nrows, ncols> ret;

      for (int k=0; k<nrows; k++)
        for (int i=0; i<ncols; i++)
        {
          ret.v[k][i]=v[k][i]+a.v[k][i];
        }

      return ret;
    }